

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayproperty.cpp
# Opt level: O0

int __thiscall camp::ArrayProperty::remove(ArrayProperty *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  ForbiddenWrite *pFVar3;
  string *psVar4;
  OutOfRange *__return_storage_ptr__;
  ulong in_RDX;
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [32];
  OutOfRange local_1b0;
  size_t local_168;
  size_t range;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  ForbiddenWrite local_110;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [48];
  ForbiddenWrite local_68;
  ulong local_20;
  size_t index_local;
  UserObject *object_local;
  ArrayProperty *this_local;
  
  local_20 = in_RDX;
  index_local = (size_t)__filename;
  object_local = (UserObject *)this;
  bVar1 = dynamic(this);
  if (!bVar1) {
    local_c2 = 1;
    pFVar3 = (ForbiddenWrite *)__cxa_allocate_exception(0x48);
    psVar4 = Property::name_abi_cxx11_(&this->super_Property);
    ForbiddenWrite::ForbiddenWrite(&local_68,psVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
               ,&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,"void camp::ArrayProperty::remove(const UserObject &, std::size_t) const",
               &local_c1);
    Error::prepare<camp::ForbiddenWrite>
              (pFVar3,&local_68,(string *)local_98,0x8d,(string *)local_c0);
    local_c2 = 0;
    __cxa_throw(pFVar3,&ForbiddenWrite::typeinfo,ForbiddenWrite::~ForbiddenWrite);
  }
  bVar1 = Property::writable(&this->super_Property,(UserObject *)index_local);
  if (!bVar1) {
    range._6_1_ = 1;
    pFVar3 = (ForbiddenWrite *)__cxa_allocate_exception(0x48);
    psVar4 = Property::name_abi_cxx11_(&this->super_Property);
    ForbiddenWrite::ForbiddenWrite(&local_110,psVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
               ,&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_158,"void camp::ArrayProperty::remove(const UserObject &, std::size_t) const",
               (allocator *)((long)&range + 7));
    Error::prepare<camp::ForbiddenWrite>
              (pFVar3,&local_110,(string *)local_130,0x91,(string *)local_158);
    range._6_1_ = 0;
    __cxa_throw(pFVar3,&ForbiddenWrite::typeinfo,ForbiddenWrite::~ForbiddenWrite);
  }
  local_168 = size(this,(UserObject *)index_local);
  if (local_168 <= local_20) {
    __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
    OutOfRange::OutOfRange(&local_1b0,local_20,local_168);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
               ,&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1f8,"void camp::ArrayProperty::remove(const UserObject &, std::size_t) const",
               &local_1f9);
    Error::prepare<camp::OutOfRange>
              (__return_storage_ptr__,&local_1b0,(string *)local_1d0,0x96,(string *)local_1f8);
    __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,OutOfRange::~OutOfRange);
  }
  iVar2 = (*(this->super_Property).super_TagHolder._vptr_TagHolder[0xc])(this,index_local,local_20);
  return iVar2;
}

Assistant:

void ArrayProperty::remove(const UserObject& object, std::size_t index) const
{
    // Check if the array is dynamic
    if (!dynamic())
        CAMP_ERROR(ForbiddenWrite(name()));

    // Check if the property is writable
    if (!writable(object))
        CAMP_ERROR(ForbiddenWrite(name()));

    // Check if the index is in range
    std::size_t range = size(object);
    if (index >= range)
        CAMP_ERROR(OutOfRange(index, range));

    return removeElement(object, index);
}